

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_function.cpp
# Opt level: O2

size_t count_words(string *input)

{
  istream *piVar1;
  runtime_error *this;
  size_t sVar2;
  string word;
  ifstream fin;
  byte abStack_200 [488];
  
  std::ifstream::ifstream(&fin,(string *)input,_S_bin);
  if ((abStack_200[*(long *)(_fin + -0x18)] & 5) == 0) {
    word._M_dataplus._M_p = (pointer)&word.field_2;
    word._M_string_length = 0;
    word.field_2._M_local_buf[0] = '\0';
    sVar2 = 0;
    while( true ) {
      piVar1 = std::operator>>((istream *)&fin,(string *)&word);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      sVar2 = sVar2 + 1;
    }
    std::__cxx11::string::~string((string *)&word);
    std::ifstream::~ifstream(&fin);
    return sVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Open input file failed!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t count_words(const std::string& input)
{
    std::ifstream fin(input, std::ios::binary);
    if (!fin)
    {
        throw std::runtime_error("Open input file failed!");
    }

    size_t words;
    std::string word;
    for (words = 0; fin >> word; ++words)
        ;

    return words;
}